

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O1

TypeDef winmd::reader::find(TypeRef *type)

{
  pointer pTVar1;
  pointer pTVar2;
  database *pdVar3;
  cache *this;
  uint uVar4;
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *pvVar5;
  __normal_iterator<const_winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>
  _Var6;
  table_base *ptVar7;
  uint32_t uVar8;
  TypeDef TVar9;
  string_view sVar10;
  string_view local_48;
  string_view local_38;
  
  local_48._M_str._4_4_ = (undefined4)(local_48._M_len >> 0x20);
  local_38._M_str._4_4_ = (undefined4)(local_38._M_len >> 0x20);
  uVar4 = table_base::get_value<unsigned_int>
                    ((type->super_row_base<winmd::reader::TypeRef>).m_table,
                     (type->super_row_base<winmd::reader::TypeRef>).m_index,0);
  if ((~uVar4 & 3) == 0) {
    ptVar7 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    uVar4 = table_base::get_value<unsigned_int>
                      (ptVar7,(type->super_row_base<winmd::reader::TypeRef>).m_index,0);
    local_38._M_str._0_4_ = (uVar4 >> 2) - 1;
    local_38._M_len = (size_t)ptVar7->m_database;
    TVar9 = find((TypeRef *)&local_38);
    local_48._0_12_ = TVar9.super_row_base<winmd::reader::TypeDef>._0_12_;
    if (TVar9.super_row_base<winmd::reader::TypeDef>.m_table != (table_base *)0x0) {
      pvVar5 = cache::nested_types((TVar9.super_row_base<winmd::reader::TypeDef>.m_table)->
                                   m_database->m_cache,(TypeDef *)&local_48);
      pTVar1 = (pvVar5->
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pTVar2 = (pvVar5->
               super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      ptVar7 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
      pdVar3 = ptVar7->m_database;
      uVar4 = table_base::get_value<unsigned_int>
                        (ptVar7,(type->super_row_base<winmd::reader::TypeRef>).m_index,1);
      sVar10 = database::get_string(pdVar3,uVar4);
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_const*,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>>,__gnu_cxx::__ops::_Iter_pred<winmd::reader::find(winmd::reader::TypeRef_const&)::_lambda(winmd::reader::TypeDef_const&)_1_>>
                        (pTVar1,pTVar2,sVar10._M_len,sVar10._M_str);
      if (_Var6._M_current !=
          (pvVar5->
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        ptVar7 = ((_Var6._M_current)->super_row_base<winmd::reader::TypeDef>).m_table;
        uVar8 = ((_Var6._M_current)->super_row_base<winmd::reader::TypeDef>).m_index;
        goto LAB_0016f0d9;
      }
    }
    uVar8 = 0;
    ptVar7 = (table_base *)0x0;
  }
  else {
    ptVar7 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    this = ptVar7->m_database->m_cache;
    pdVar3 = ptVar7->m_database;
    uVar4 = table_base::get_value<unsigned_int>
                      (ptVar7,(type->super_row_base<winmd::reader::TypeRef>).m_index,2);
    local_48 = database::get_string(pdVar3,uVar4);
    ptVar7 = (type->super_row_base<winmd::reader::TypeRef>).m_table;
    pdVar3 = ptVar7->m_database;
    uVar4 = table_base::get_value<unsigned_int>
                      (ptVar7,(type->super_row_base<winmd::reader::TypeRef>).m_index,1);
    local_38 = database::get_string(pdVar3,uVar4);
    TVar9 = cache::find(this,&local_48,&local_38);
    ptVar7 = TVar9.super_row_base<winmd::reader::TypeDef>.m_table;
    uVar8 = TVar9.super_row_base<winmd::reader::TypeDef>.m_index;
  }
LAB_0016f0d9:
  TVar9.super_row_base<winmd::reader::TypeDef>.m_index = uVar8;
  TVar9.super_row_base<winmd::reader::TypeDef>.m_table = ptVar7;
  TVar9.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
  return (TypeDef)TVar9.super_row_base<winmd::reader::TypeDef>;
}

Assistant:

inline auto find(TypeRef const& type)
    {
        if (type.ResolutionScope().type() != ResolutionScope::TypeRef)
        {
            return type.get_database().get_cache().find(type.TypeNamespace(), type.TypeName());
        }
        else
        {
            auto enclosing_type = find(type.ResolutionScope().TypeRef());
            if (!enclosing_type)
            {
                return TypeDef{};
            }
            auto const& nested_types = enclosing_type.get_cache().nested_types(enclosing_type);
            auto iter = std::find_if(nested_types.begin(), nested_types.end(),
                [name = type.TypeName()](TypeDef const& arg)
            {
                return name == arg.TypeName();
            });
            if (iter == nested_types.end())
            {
                return TypeDef{};
            }
            return *iter;
        }
    }